

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O2

void __thiscall
itlib::
flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
::flat_map(flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
           *this,initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>
                 init,key_compare *comp,allocator_type *alloc)

{
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  __first;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
  ::vector(&this->m_container,init,alloc);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>,__gnu_cxx::__ops::_Iter_comp_iter<itlib::fmimpl::pair_compare<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less>>>
            ((this->m_container).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_container).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,Rml::BoxArea>*,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>,__gnu_cxx::__ops::_Iter_comp_iter<itlib::flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>::flat_map(std::initializer_list<std::pair<std::__cxx11::string,Rml::BoxArea>>,itlib::fmimpl::less_const&,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>const&)::_lambda(std::pair<std::__cxx11::string,Rml::BoxArea>const&,std::pair<std::__cxx11::string,Rml::BoxArea>const&)_1_>>
                      ((this->m_container).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_container).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mikke89[P]RmlUi_Source_Core_______Include_RmlUi_Core____Config____Core_Containers_itlib_flat_map_hpp:170:76)>
                        )this);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
  ::erase(&this->m_container,(const_iterator)__first._M_current,
          (this->m_container).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

flat_map(std::initializer_list<value_type> init, const key_compare& comp = key_compare(), const allocator_type& alloc = allocator_type())
        : pair_compare(comp)
        , m_container(std::move(init), alloc)
    {
        std::sort(m_container.begin(), m_container.end(), cmp());
        auto new_end = std::unique(m_container.begin(), m_container.end(), [this](const value_type& a, const value_type& b) {
            return !cmp()(a, b) && !cmp()(b, a);
        });
        m_container.erase(new_end, m_container.end());
    }